

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

bool re2::IsAnchorEnd(Regexp **pre,int depth)

{
  uint8_t uVar1;
  ushort uVar2;
  Regexp *this;
  bool bVar3;
  ulong uVar4;
  Regexp **sub_00;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar5;
  Regexp *pRVar6;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar7;
  long lVar8;
  Regexp *sub;
  new_allocator<re2::Regexp_*> local_39;
  Regexp *local_38;
  
  this = *pre;
  if (depth < 4 && this != (Regexp *)0x0) {
    uVar1 = this->op_;
    if (uVar1 == '\x13') {
      pRVar6 = Regexp::LiteralString((Rune *)0x0,0,(uint)this->parse_flags_);
LAB_001c557a:
      *pre = pRVar6;
      Regexp::Decref(this);
      return true;
    }
    if (uVar1 == '\v') {
      if (this->nsub_ < 2) {
        paVar7 = &this->field_5;
      }
      else {
        paVar7 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      local_38 = Regexp::Incref(paVar7->subone_);
      bVar3 = IsAnchorEnd(&local_38,depth + 1);
      if (bVar3) {
        pRVar6 = Regexp::Capture(local_38,(uint)this->parse_flags_,(this->field_7).field_0.max_);
        goto LAB_001c557a;
      }
    }
    else {
      if (uVar1 != '\x05') {
        return false;
      }
      uVar4 = (ulong)this->nsub_;
      if (uVar4 == 0) {
        return false;
      }
      paVar7 = &this->field_5;
      paVar5 = paVar7;
      if (uVar4 != 1) {
        paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      local_38 = Regexp::Incref(paVar5[uVar4 - 1].subone_);
      bVar3 = IsAnchorEnd(&local_38,depth + 1);
      if (bVar3) {
        sub_00 = __gnu_cxx::new_allocator<re2::Regexp_*>::allocate
                           (&local_39,(ulong)this->nsub_,(void *)0x0);
        uVar2 = this->nsub_;
        uVar4 = (ulong)uVar2;
        sub_00[uVar4 - 1] = local_38;
        if (1 < uVar2) {
          lVar8 = 0;
          do {
            paVar5 = paVar7;
            if (1 < (ushort)uVar4) {
              paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)paVar7->submany_;
            }
            pRVar6 = Regexp::Incref(paVar5[lVar8].subone_);
            sub_00[lVar8] = pRVar6;
            lVar8 = lVar8 + 1;
            uVar2 = this->nsub_;
            uVar4 = (ulong)uVar2;
          } while (lVar8 < (long)(uVar4 - 1));
        }
        pRVar6 = Regexp::Concat(sub_00,(uint)uVar2,(uint)this->parse_flags_);
        *pre = pRVar6;
        Regexp::Decref(this);
        if (sub_00 != (Regexp **)0x0) {
          operator_delete(sub_00);
          return true;
        }
        return true;
      }
    }
    Regexp::Decref(local_38);
  }
  return false;
}

Assistant:

static bool IsAnchorEnd(Regexp** pre, int depth) {
  Regexp* re = *pre;
  Regexp* sub;
  // The depth limit makes sure that we don't overflow
  // the stack on a deeply nested regexp.  As the comment
  // above says, IsAnchorEnd is conservative, so returning
  // a false negative is okay.  The exact limit is somewhat arbitrary.
  if (re == NULL || depth >= 4)
    return false;
  switch (re->op()) {
    default:
      break;
    case kRegexpConcat:
      if (re->nsub() > 0) {
        sub = re->sub()[re->nsub() - 1]->Incref();
        if (IsAnchorEnd(&sub, depth+1)) {
          PODArray<Regexp*> subcopy(re->nsub());
          subcopy[re->nsub() - 1] = sub;  // already have reference
          for (int i = 0; i < re->nsub() - 1; i++)
            subcopy[i] = re->sub()[i]->Incref();
          *pre = Regexp::Concat(subcopy.data(), re->nsub(), re->parse_flags());
          re->Decref();
          return true;
        }
        sub->Decref();
      }
      break;
    case kRegexpCapture:
      sub = re->sub()[0]->Incref();
      if (IsAnchorEnd(&sub, depth+1)) {
        *pre = Regexp::Capture(sub, re->parse_flags(), re->cap());
        re->Decref();
        return true;
      }
      sub->Decref();
      break;
    case kRegexpEndText:
      *pre = Regexp::LiteralString(NULL, 0, re->parse_flags());
      re->Decref();
      return true;
  }
  return false;
}